

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O0

string * ANSsint<1u>::name_abi_cxx11_(void)

{
  string *in_RDI;
  string local_60 [28];
  uint in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,
             (allocator<char> *)in_stack_ffffffffffffffc0);
  std::__cxx11::to_string(in_stack_ffffffffffffffbc);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::__cxx11::string::~string(local_60);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return in_RDI;
}

Assistant:

static std::string name()
    {
        return std::string("ANSsint-") + std::to_string(H_approx);
    }